

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O0

void __thiscall Scanner::set_new_state(Scanner *this,char c)

{
  int iVar1;
  char c_local;
  Scanner *this_local;
  
  iVar1 = isspace((int)c);
  if (iVar1 == 0) {
    if (c == '\'') {
      this->state = QUOTE_;
      this->last_qoute_line = this->lines;
    }
    else {
      iVar1 = isalpha((int)c);
      if (iVar1 == 0) {
        if (c == '#') {
          this->state = COMMENT_;
        }
        else {
          this->state = ERR_;
        }
      }
      else {
        this->state = ID_;
      }
    }
  }
  else {
    this->state = MASTER_;
  }
  return;
}

Assistant:

void Scanner::set_new_state(char c)
{
	if (isspace(c)) state = MASTER_;
	else if (c == '\'')
  {
    state = QUOTE_;
    last_qoute_line = lines;
  }
	else if (isalpha(c)) state = ID_;
  else if (c == '#') state = COMMENT_; //start of comment
	else state = ERR_; // not a whitespace separator, but not the start of a valid token
}